

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_sign_with_k(uint8_t *private_key,uint8_t *message_hash,uECC_word_t *k,uint8_t *signature)

{
  bool bVar1;
  cmpresult_t cVar2;
  int iVar3;
  uECC_word_t uVar4;
  ulong local_d8;
  uECC_word_t tries;
  uECC_word_t carry;
  EccPoint p;
  uECC_word_t *k2 [2];
  uECC_word_t s [4];
  uECC_word_t tmp [4];
  uint8_t *signature_local;
  uECC_word_t *k_local;
  uint8_t *message_hash_local;
  uint8_t *private_key_local;
  
  p.y[3] = (uECC_word_t)(s + 3);
  k2[0] = (uECC_word_t *)(k2 + 1);
  uVar4 = vli_isZero(k);
  if ((uVar4 == 0) && (cVar2 = vli_cmp(curve_n,k), cVar2 == 1)) {
    uVar4 = vli_add(s + 3,k,curve_n);
    vli_add((uECC_word_t *)(k2 + 1),s + 3,curve_n);
    EccPoint_mult((EccPoint *)&carry,&curve_G,
                  (uECC_word_t *)p.y[(long)(int)(uint)((uVar4 != 0 ^ 0xffU) & 1) + 3],
                  (uECC_word_t *)0x0,0x101);
    cVar2 = vli_cmp(curve_n,&carry);
    if (cVar2 != 1) {
      vli_sub(&carry,&carry,curve_n);
    }
    uVar4 = vli_isZero(&carry);
    if (uVar4 == 0) {
      bVar1 = false;
      for (local_d8 = 0; local_d8 < 0x40; local_d8 = local_d8 + 1) {
        iVar3 = (*g_rng_function)((uint8_t *)(s + 3),0x20);
        if (iVar3 != 0) {
          bVar1 = true;
          uVar4 = vli_isZero(s + 3);
          if (uVar4 == 0) break;
        }
      }
      if (!bVar1) {
        vli_clear(s + 3);
        s[3] = 1;
      }
      vli_modMult_n(k,k,s + 3);
      vli_modInv(k,k,curve_n);
      vli_modMult_n(k,k,s + 3);
      vli_nativeToBytes(signature,&carry);
      vli_bytesToNative(s + 3,private_key);
      s[2] = 0;
      vli_set((uECC_word_t *)(k2 + 1),&carry);
      vli_modMult_n((uECC_word_t *)(k2 + 1),s + 3,(uECC_word_t *)(k2 + 1));
      vli_bytesToNative(s + 3,message_hash);
      vli_modAdd((uECC_word_t *)(k2 + 1),s + 3,(uECC_word_t *)(k2 + 1),curve_n);
      vli_modMult_n((uECC_word_t *)(k2 + 1),(uECC_word_t *)(k2 + 1),k);
      vli_nativeToBytes(signature + 0x20,(uint64_t *)(k2 + 1));
      private_key_local._4_4_ = 1;
    }
    else {
      private_key_local._4_4_ = 0;
    }
  }
  else {
    private_key_local._4_4_ = 0;
  }
  return private_key_local._4_4_;
}

Assistant:

static int uECC_sign_with_k(const uint8_t private_key[uECC_BYTES],
                            const uint8_t message_hash[uECC_BYTES],
                            uECC_word_t k[uECC_N_WORDS],
                            uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t tmp[uECC_N_WORDS];
    uECC_word_t s[uECC_N_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
    EccPoint p;
    uECC_word_t carry;
    uECC_word_t tries;

    /* Make sure 0 < k < curve_n */
    if (vli_isZero(k) || vli_cmp_n(curve_n, k) != 1) {
        return 0;
    }

#if (uECC_CURVE == uECC_secp160r1)
    /* Make sure that we don't leak timing information about k.
       See http://eprint.iacr.org/2011/232.pdf */
    vli_add_n(tmp, k, curve_n);
    carry = (tmp[uECC_WORDS] & 0x02);
    vli_add_n(s, tmp, curve_n);

    /* p = k * G */
    EccPoint_mult(&p, &curve_G, k2[!carry], 0, (uECC_BYTES * 8) + 2);
#else
    /* Make sure that we don't leak timing information about k.
       See http://eprint.iacr.org/2011/232.pdf */
    carry = vli_add(tmp, k, curve_n);
    vli_add(s, tmp, curve_n);

    /* p = k * G */
    EccPoint_mult(&p, &curve_G, k2[!carry], 0, (uECC_BYTES * 8) + 1);

    /* r = x1 (mod n) */
    if (vli_cmp(curve_n, p.x) != 1) {
        vli_sub(p.x, p.x, curve_n);
    }
#endif
    if (vli_isZero(p.x)) {
        return 0;
    }

    // Attempt to get a random number to prevent side channel analysis of k.
    // If the RNG fails every time (eg it was not defined), we continue so that
    // deterministic signing can still work (with reduced security) without
    // an RNG defined.
    carry = 0; // use to signal that the RNG succeeded at least once.
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (!g_rng_function((uint8_t *)tmp, sizeof(tmp))) {
            continue;
        }
        carry = 1;
        if (!vli_isZero(tmp)) {
            break;
        }
    }
    if (!carry) {
        vli_clear(tmp);
        tmp[0] = 1;
    }

    /* Prevent side channel analysis of vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    vli_modMult_n(k, k, tmp); /* k' = rand * k */
    vli_modInv_n(k, k, curve_n); /* k = 1 / k' */
    vli_modMult_n(k, k, tmp); /* k = 1 / k */

    vli_nativeToBytes(signature, p.x); /* store r */

    tmp[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(tmp, private_key); /* tmp = d */
    s[uECC_N_WORDS - 1] = 0;
    vli_set(s, p.x);
    vli_modMult_n(s, tmp, s); /* s = r*d */

    vli_bytesToNative(tmp, message_hash);
    vli_modAdd_n(s, tmp, s, curve_n); /* s = e + r*d */
    vli_modMult_n(s, s, k); /* s = (e + r*d) / k */
#if (uECC_CURVE == uECC_secp160r1)
    if (s[uECC_N_WORDS - 1]) {
        return 0;
    }
#endif
    vli_nativeToBytes(signature + uECC_BYTES, s);
    return 1;
}